

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O0

ReadFileResult
cmCMakePresetsGraphInternal::PresetOptionalBoolHelper(optional<bool> *out,Value *value)

{
  int iVar1;
  ReadFileResult RVar2;
  _func_ReadFileResult_bool_ptr_Value_ptr *in_RCX;
  Value *value_local;
  optional<bool> *out_local;
  
  if (PresetOptionalBoolHelper(std::optional<bool>&,Json::Value_const*)::helper == '\0') {
    iVar1 = __cxa_guard_acquire(&PresetOptionalBoolHelper(std::optional<bool>&,Json::Value_const*)::
                                 helper);
    if (iVar1 != 0) {
      cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
      Optional<bool,cmCMakePresetsGraph::ReadFileResult(*)(bool&,Json::Value_const*)>
                (&PresetOptionalBoolHelper::helper,
                 (cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult> *)0x0,0x56d080,in_RCX);
      __cxa_atexit(std::
                   function<cmCMakePresetsGraph::ReadFileResult_(std::optional<bool>_&,_const_Json::Value_*)>
                   ::~function,&PresetOptionalBoolHelper::helper,&__dso_handle);
      __cxa_guard_release(&PresetOptionalBoolHelper(std::optional<bool>&,Json::Value_const*)::helper
                         );
    }
  }
  RVar2 = std::
          function<cmCMakePresetsGraph::ReadFileResult_(std::optional<bool>_&,_const_Json::Value_*)>
          ::operator()(&PresetOptionalBoolHelper::helper,out,value);
  return RVar2;
}

Assistant:

cmCMakePresetsGraph::ReadFileResult PresetOptionalBoolHelper(
  cm::optional<bool>& out, const Json::Value* value)
{
  static auto const helper = JSONHelperBuilder::Optional<bool>(
    ReadFileResult::READ_OK, PresetBoolHelper);

  return helper(out, value);
}